

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_struct_padding_target(CompilerMSL *this,SPIRType *type)

{
  uint32_t uVar1;
  uint32_t uVar2;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = get_declared_struct_size_msl(this,type,true,true);
  uVar2 = Compiler::get_extended_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,
                     SPIRVCrossDecorationPaddingTarget);
  if (uVar1 <= uVar2) {
    if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
      local_40[0] = (undefined1 *)CONCAT44(local_40[0]._4_4_,uVar2 - uVar1);
      CompilerGLSL::statement<char_const(&)[24],unsigned_int,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [24])"char _m0_final_padding[",(uint *)local_40
                 ,(char (*) [3])0x3690a0);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Cannot pad with negative bytes.","");
  ::std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_003fce08;
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerMSL::emit_struct_padding_target(const SPIRType &type)
{
	uint32_t struct_size = get_declared_struct_size_msl(type, true, true);
	uint32_t target_size = get_extended_decoration(type.self, SPIRVCrossDecorationPaddingTarget);
	if (target_size < struct_size)
		SPIRV_CROSS_THROW("Cannot pad with negative bytes.");
	else if (target_size > struct_size)
		statement("char _m0_final_padding[", target_size - struct_size, "];");
}